

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void stream_read_callback(pa_stream *s,size_t nbytes,void *u)

{
  int iVar1;
  long in_RDX;
  pa_stream *in_RDI;
  long got;
  size_t write_size;
  size_t out_frame_size;
  size_t read_frames;
  size_t in_frame_size;
  size_t read_size;
  void *read_data;
  cubeb_stream_conflict *stm;
  size_t *in_stack_ffffffffffffffa8;
  void **in_stack_ffffffffffffffb0;
  pa_stream *in_stack_ffffffffffffffb8;
  long local_30;
  
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (CUBEB_LOG_NORMAL < g_cubeb_log_level)) {
    (*g_cubeb_log_callback)("%s:%d: Input callback buffer size %zd\n","cubeb_pulse.c",0x167);
  }
  iVar1 = *(int *)(in_RDX + 0x50);
  while ((iVar1 == 0 &&
         (iVar1 = read_from_input(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffa8), 0 < iVar1))) {
    if (local_30 != 0) {
      (*cubeb_pa_stream_drop)(in_RDI);
    }
    iVar1 = *(int *)(in_RDX + 0x50);
  }
  return;
}

Assistant:

static void
stream_read_callback(pa_stream * s, size_t nbytes, void * u)
{
  LOGV("Input callback buffer size %zd", nbytes);
  cubeb_stream * stm = u;
  if (stm->shutdown) {
    return;
  }

  void const * read_data = NULL;
  size_t read_size;
  while (read_from_input(s, &read_data, &read_size) > 0) {
    /* read_data can be NULL in case of a hole. */
    if (read_data) {
      size_t in_frame_size = WRAP(pa_frame_size)(&stm->input_sample_spec);
      size_t read_frames = read_size / in_frame_size;

      if (stm->output_stream) {
        // input/capture + output/playback operation
        size_t out_frame_size = WRAP(pa_frame_size)(&stm->output_sample_spec);
        size_t write_size = read_frames * out_frame_size;
        // Offer full duplex data for writing
        trigger_user_callback(stm->output_stream, read_data, write_size, stm);
      } else {
        // input/capture only operation. Call callback directly
        long got = stm->data_callback(stm, stm->user_ptr, read_data, NULL, read_frames);
        if (got < 0 || (size_t) got != read_frames) {
          WRAP(pa_stream_cancel_write)(s);
          stm->shutdown = 1;
          break;
        }
      }
    }
    if (read_size > 0) {
      WRAP(pa_stream_drop)(s);
    }

    if (stm->shutdown) {
      return;
    }
  }
}